

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS0.cpp
# Opt level: O1

bool __thiscall RTIMULSM9DS0::setAccelCTRL2(RTIMULSM9DS0 *this)

{
  uint uVar1;
  uint uVar2;
  RTIMUSettings *this_00;
  bool bVar3;
  char *__format;
  
  this_00 = (this->super_RTIMU).m_settings;
  uVar1 = this_00->m_LSM9DS0AccelLpf;
  if (uVar1 < 4) {
    uVar2 = this_00->m_LSM9DS0AccelFsr;
    if ((ulong)uVar2 < 5) {
      this->m_accelScale = *(RTFLOAT *)(&DAT_00123aa8 + (ulong)uVar2 * 4);
      bVar3 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_accelCompassSlaveAddr,'!',
                                 (char)uVar1 * '@' + (char)uVar2 * '\b',
                                 "Failed to set LSM9DS0 accel CTRL2");
      return bVar3;
    }
    __format = "Illegal LSM9DS0 accel FSR code %d\n";
    uVar1 = uVar2;
  }
  else {
    __format = "Illegal LSM9DS0 accel low pass fiter code %d\n";
  }
  fprintf(_stderr,__format,(ulong)uVar1);
  return false;
}

Assistant:

bool RTIMULSM9DS0::setAccelCTRL2()
{
    unsigned char ctrl2;

    if ((m_settings->m_LSM9DS0AccelLpf < 0) || (m_settings->m_LSM9DS0AccelLpf > 3)) {
        HAL_ERROR1("Illegal LSM9DS0 accel low pass fiter code %d\n", m_settings->m_LSM9DS0AccelLpf);
        return false;
    }

    switch (m_settings->m_LSM9DS0AccelFsr) {
    case LSM9DS0_ACCEL_FSR_2:
        m_accelScale = (RTFLOAT)0.000061;
        break;

    case LSM9DS0_ACCEL_FSR_4:
        m_accelScale = (RTFLOAT)0.000122;
        break;

    case LSM9DS0_ACCEL_FSR_6:
        m_accelScale = (RTFLOAT)0.000183;
        break;

    case LSM9DS0_ACCEL_FSR_8:
        m_accelScale = (RTFLOAT)0.000244;
        break;

    case LSM9DS0_ACCEL_FSR_16:
        m_accelScale = (RTFLOAT)0.000732;
        break;

    default:
        HAL_ERROR1("Illegal LSM9DS0 accel FSR code %d\n", m_settings->m_LSM9DS0AccelFsr);
        return false;
    }

    ctrl2 = (m_settings->m_LSM9DS0AccelLpf << 6) | (m_settings->m_LSM9DS0AccelFsr << 3);

    return m_settings->HALWrite(m_accelCompassSlaveAddr,  LSM9DS0_CTRL2, ctrl2, "Failed to set LSM9DS0 accel CTRL2");
}